

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

void __thiscall xatlas::internal::param::Chart::~Chart(Chart *this)

{
  Chart *this_local;
  
  if (this->m_mesh != (Mesh *)0x0) {
    Mesh::~Mesh(this->m_mesh);
    Realloc(this->m_mesh,0,0,
            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
            ,0x1ab7);
  }
  if (this->m_unifiedMesh != (Mesh *)0x0) {
    Mesh::~Mesh(this->m_unifiedMesh);
    Realloc(this->m_unifiedMesh,0,0,
            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
            ,0x1abb);
  }
  if (this->m_unmodifiedUnifiedMesh != (Mesh *)0x0) {
    Mesh::~Mesh(this->m_unmodifiedUnifiedMesh);
    Realloc(this->m_unmodifiedUnifiedMesh,0,0,
            "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/xatlas/xatlas.cpp"
            ,0x1abf);
  }
  Array<unsigned_int>::~Array(&this->m_chartToUnifiedMap);
  Array<unsigned_int>::~Array(&this->m_chartToOriginalMap);
  Array<unsigned_int>::~Array(&this->m_faceArray);
  return;
}

Assistant:

~Chart()
	{
		if (m_mesh) {
			m_mesh->~Mesh();
			XA_FREE(m_mesh);
		}
		if (m_unifiedMesh) {
			m_unifiedMesh->~Mesh();
			XA_FREE(m_unifiedMesh);
		}
		if (m_unmodifiedUnifiedMesh) {
			m_unmodifiedUnifiedMesh->~Mesh();
			XA_FREE(m_unmodifiedUnifiedMesh);
		}
	}